

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O3

bool __thiscall cmCTestCVS::WriteXMLUpdates(cmCTestCVS *this,cmXMLWriter *xml)

{
  cmCTest *pcVar1;
  _Rb_tree_node_base *p_Var2;
  ostringstream cmCTestLog_msg;
  long *local_1c8;
  long local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"   Gathering version information (one . per updated file):\n    "
             ,0x3f);
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCVS.cxx"
               ,0x135,(char *)local_1c8,false);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  for (p_Var2 = (this->Dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->Dirs)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    WriteXMLDirectory(this,xml,(string *)(p_Var2 + 1),(Directory *)(p_Var2 + 2));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCVS.cxx"
               ,0x13d,(char *)local_1c8,false);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return true;
}

Assistant:

bool cmCTestCVS::WriteXMLUpdates(cmXMLWriter& xml)
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Gathering version information (one . per updated file):\n"
             "    " << std::flush);

  for(std::map<std::string, Directory>::const_iterator
        di = this->Dirs.begin(); di != this->Dirs.end(); ++di)
    {
    this->WriteXMLDirectory(xml, di->first, di->second);
    }

  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl);

  return true;
}